

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O2

bool __thiscall
google::protobuf::internal::MergeFromImpl<true>
          (internal *this,StringPiece input,MessageLite *msg,ParseFlags parse_flags)

{
  bool bVar1;
  ParseContext *ctx_00;
  undefined1 auVar2 [12];
  undefined1 local_b0 [8];
  ParseContext ctx;
  StringPiece input_local;
  char *ptr;
  
  ctx_00 = (ParseContext *)input.length_;
  input_local.ptr_ = input.ptr_;
  ctx.data_.factory = (MessageFactory *)this;
  ParseContext::ParseContext<google::protobuf::StringPiece&>
            ((ParseContext *)local_b0,io::CodedInputStream::default_recursion_limit_,true,
             (char **)&input_local.length_,(StringPiece *)&ctx.data_.factory);
  auVar2 = (**(code **)((ctx_00->super_EpsCopyInputStream).limit_end_ + 0x58))
                     (ctx_00,input_local.length_,(ParseContext *)local_b0);
  input_local.length_ = auVar2._0_8_;
  bVar1 = false;
  if ((input_local.length_ != 0) &&
     (bVar1 = false, (int)ctx.super_EpsCopyInputStream.aliasing_ == 0)) {
    bVar1 = anon_unknown_17::CheckFieldPresence
                      (ctx_00,(MessageLite *)((ulong)msg & 0xffffffff),auVar2._8_4_);
  }
  return bVar1;
}

Assistant:

bool MergeFromImpl(StringPiece input, MessageLite* msg,
                   MessageLite::ParseFlags parse_flags) {
  const char* ptr;
  internal::ParseContext ctx(io::CodedInputStream::GetDefaultRecursionLimit(),
                             aliasing, &ptr, input);
  ptr = msg->_InternalParse(ptr, &ctx);
  // ctx has an explicit limit set (length of string_view).
  if (PROTOBUF_PREDICT_TRUE(ptr && ctx.EndedAtLimit())) {
    return CheckFieldPresence(ctx, *msg, parse_flags);
  }
  return false;
}